

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBlifMv.c
# Opt level: O3

Io_MvVar_t * Abc_NtkMvVarDup(Abc_Ntk_t *pNtk,Io_MvVar_t *pVar)

{
  int iVar1;
  void *pvVar2;
  Mem_Flex_t *p;
  Io_MvVar_t *pIVar3;
  char **ppcVar4;
  size_t sVar5;
  char *pcVar6;
  long lVar7;
  
  if (pVar == (Io_MvVar_t *)0x0) {
    pIVar3 = (Io_MvVar_t *)0x0;
  }
  else {
    if (pNtk->vAttrs->nSize < 0xd) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    pvVar2 = pNtk->vAttrs->pArray[0xc];
    if ((pvVar2 == (void *)0x0) ||
       (p = *(Mem_Flex_t **)((long)pvVar2 + 0x10), p == (Mem_Flex_t *)0x0)) {
      __assert_fail("pFlex != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioReadBlifMv.c"
                    ,0x88d,"Io_MvVar_t *Abc_NtkMvVarDup(Abc_Ntk_t *, Io_MvVar_t *)");
    }
    pIVar3 = (Io_MvVar_t *)Mem_FlexEntryFetch(p,0x10);
    iVar1 = pVar->nValues;
    pIVar3->nValues = iVar1;
    pIVar3->pNames = (char **)0x0;
    if (pVar->pNames != (char **)0x0) {
      ppcVar4 = (char **)Mem_FlexEntryFetch(p,iVar1 << 3);
      pIVar3->pNames = ppcVar4;
      if (0 < pVar->nValues) {
        lVar7 = 0;
        do {
          sVar5 = strlen(pVar->pNames[lVar7]);
          pcVar6 = Mem_FlexEntryFetch(p,(int)sVar5 + 1);
          pIVar3->pNames[lVar7] = pcVar6;
          strcpy(pIVar3->pNames[lVar7],pVar->pNames[lVar7]);
          lVar7 = lVar7 + 1;
        } while (lVar7 < pVar->nValues);
      }
    }
  }
  return pIVar3;
}

Assistant:

Io_MvVar_t * Abc_NtkMvVarDup( Abc_Ntk_t * pNtk, Io_MvVar_t * pVar )
{
    Mem_Flex_t * pFlex;
    Io_MvVar_t * pVarDup;
    int i;
    if ( pVar == NULL )
        return NULL;
    pFlex = (Mem_Flex_t *)Abc_NtkMvVarMan( pNtk );
    assert( pFlex != NULL );
    pVarDup = (Io_MvVar_t *)Mem_FlexEntryFetch( pFlex, sizeof(Io_MvVar_t) );
    pVarDup->nValues = pVar->nValues;
    pVarDup->pNames = NULL;
    if ( pVar->pNames == NULL )
        return pVarDup;
    pVarDup->pNames = (char **)Mem_FlexEntryFetch( pFlex, sizeof(char *) * pVar->nValues );
    for ( i = 0; i < pVar->nValues; i++ )
    {
        pVarDup->pNames[i] = (char *)Mem_FlexEntryFetch( pFlex, strlen(pVar->pNames[i]) + 1 );
        strcpy( pVarDup->pNames[i], pVar->pNames[i] );
    }
    return pVarDup;
}